

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O3

bool __thiscall neueda::cdr::getInteger(cdr *this,cdrKey_t *key,uint8_t *value)

{
  bool bVar1;
  int64_t tmp;
  ulong local_10;
  
  bVar1 = getInteger(this,key,(int64_t *)&local_10);
  if ((bVar1) && (local_10 < 0x100)) {
    *value = (uint8_t)local_10;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
cdr::getInteger (const cdrKey_t& key, uint8_t& value) const
{
    int64_t tmp;
    if (!getInteger (key, tmp))
        return false;
    if (tmp < 0 || tmp > UINT8_MAX)
        return false;
    value = tmp;
    return true;
}